

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnRt4AddPalCommand::Execute
          (DrawColumnRt4AddPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  long lVar12;
  
  iVar1 = (this->super_PalRtCommand).yl;
  iVar6 = ((this->super_PalRtCommand).yh - iVar1) + 1;
  iVar11 = thread->pass_end_y - iVar1;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (iVar6 < iVar11) {
    iVar11 = iVar6;
  }
  uVar8 = thread->pass_start_y - iVar1;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar6 = thread->num_cores;
  iVar9 = (iVar6 - (int)((iVar1 + uVar8) - thread->core) % iVar6) % iVar6;
  iVar11 = (int)((~uVar8 + iVar6 + iVar11) - iVar9) / iVar6;
  if (0 < iVar11) {
    puVar2 = (this->super_PalRtCommand)._srcblend;
    iVar9 = iVar1 + uVar8 + iVar9;
    puVar3 = (this->super_PalRtCommand)._destblend;
    iVar7 = iVar9 / iVar6 << 2;
    puVar4 = thread->dc_temp;
    iVar1 = (this->super_PalRtCommand)._pitch;
    puVar5 = (this->super_PalRtCommand)._colormap;
    pbVar10 = (this->super_PalRtCommand)._destorg +
              (long)((this->super_PalRtCommand).sx + (&ylookup)[iVar9]) + 3;
    lVar12 = 0;
    do {
      uVar8 = puVar3[pbVar10[-3]] + puVar2[puVar5[puVar4[lVar12 * 4 + (long)iVar7]]] | 0x1f07c1f;
      pbVar10[-3] = RGB32k.All[uVar8 >> 0xf & uVar8];
      uVar8 = puVar3[pbVar10[-2]] + puVar2[puVar5[puVar4[lVar12 * 4 + (long)iVar7 + 1]]] | 0x1f07c1f
      ;
      pbVar10[-2] = RGB32k.All[uVar8 >> 0xf & uVar8];
      uVar8 = puVar3[pbVar10[-1]] + puVar2[puVar5[puVar4[lVar12 * 4 + (long)iVar7 + 2]]] | 0x1f07c1f
      ;
      pbVar10[-1] = RGB32k.All[uVar8 >> 0xf & uVar8];
      uVar8 = puVar3[*pbVar10] + puVar2[puVar5[puVar4[lVar12 * 4 + (long)iVar7 + 3]]] | 0x1f07c1f;
      *pbVar10 = RGB32k.All[uVar8 >> 0xf & uVar8];
      lVar12 = lVar12 + 1;
      pbVar10 = pbVar10 + iVar6 * iVar1;
    } while (iVar11 != (int)lVar12);
  }
  return;
}

Assistant:

void DrawColumnRt4AddPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t fg = colormap[source[0]];
			uint32_t bg = dest[0];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[0] = RGB32k.All[fg & (fg>>15)];

			fg = colormap[source[1]];
			bg = dest[1];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[1] = RGB32k.All[fg & (fg>>15)];


			fg = colormap[source[2]];
			bg = dest[2];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[2] = RGB32k.All[fg & (fg>>15)];

			fg = colormap[source[3]];
			bg = dest[3];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[3] = RGB32k.All[fg & (fg>>15)];

			source += 4;
			dest += pitch;
		} while (--count);
	}